

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fhandle.h
# Opt level: O2

uint64_t __thiscall filehandle::size(filehandle *this)

{
  int iVar1;
  system_error *this_00;
  int *piVar2;
  error_category *peVar3;
  code *pcVar4;
  undefined *puVar5;
  uint64_t devsize;
  stat st;
  
  iVar1 = fh(this);
  iVar1 = fstat(iVar1,(stat *)&st);
  if (iVar1 == 0) {
    if ((short)st.st_mode < 0) {
      return st.st_size;
    }
    if ((st.st_mode & 0x6000) == 0) {
      this_00 = (system_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                ((runtime_error *)this_00,"size not implemented for pipe or socket");
      puVar5 = &std::runtime_error::typeinfo;
      pcVar4 = std::runtime_error::~runtime_error;
      goto LAB_00103dce;
    }
    iVar1 = fh(this);
    iVar1 = ioctl(iVar1,0x80081272,&devsize);
    if (iVar1 != -1) {
      return devsize;
    }
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    peVar3 = (error_category *)std::_V2::generic_category();
    std::system_error::system_error(this_00,iVar1,peVar3,"ioctl(BLKGETSIZE64)");
  }
  else {
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    peVar3 = (error_category *)std::_V2::generic_category();
    std::system_error::system_error(this_00,iVar1,peVar3,"fstat");
  }
  puVar5 = &std::system_error::typeinfo;
  pcVar4 = std::system_error::~system_error;
LAB_00103dce:
  __cxa_throw(this_00,puVar5,pcVar4);
}

Assistant:

uint64_t size()
    {
        struct stat st;
        if (fstat(fh(), &st))
            throw std::system_error(errno, std::generic_category(), "fstat");

        if (st.st_mode&S_IFREG)
            return st.st_size;
#ifndef _WIN32
        else if (st.st_mode&S_IFBLK) {
#ifdef DKIOCGETBLOCKCOUNT
            uint64_t bkcount;
            uint32_t bksize;
            if (-1==ioctl(fh(), DKIOCGETBLOCKCOUNT, &bkcount))
                throw std::system_error(errno, std::generic_category(), "ioctl(DKIOCGETBLOCKCOUNT)");
            if (-1==ioctl(fh(), DKIOCGETBLOCKSIZE, &bksize))
                throw std::system_error(errno, std::generic_category(), "ioctl(DKIOCGETBLOCKSIZE)");
            return bkcount*bksize;
#elif defined(BLKGETSIZE64)
            uint64_t devsize;
            if (-1==ioctl(fh(), BLKGETSIZE64, &devsize))
                throw std::system_error(errno, std::generic_category(), "ioctl(BLKGETSIZE64)");
            return devsize;
#else
            throw std::runtime_error("size not implemented for block dev");
#endif
        }
#endif
        else {
            // pipe or socket
            throw std::runtime_error("size not implemented for pipe or socket");
        }